

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O1

void lock_test1(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  spki_record *__ptr;
  int iVar3;
  uint8_t *ski;
  long lVar4;
  uint i;
  undefined8 *puVar5;
  int iVar6;
  spki_record **ppsVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 local_4e8;
  undefined4 local_4e0 [76];
  undefined8 uStack_3b0;
  undefined1 auStack_3a8 [8];
  undefined1 *local_3a0;
  uint local_394;
  spki_record *psStack_390;
  uint result_size;
  spki_record *result;
  undefined8 local_2e8;
  undefined4 local_2e0 [78];
  undefined1 local_1a8 [8];
  spki_table spkit;
  
  local_3a0 = auStack_3a8;
  spkit.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  uStack_3b0 = 0x1022a3;
  spki_table_init((spki_table *)local_1a8,(spki_update_fp)0x0);
  puVar5 = &local_2e8;
  ppsVar7 = &result;
  do {
    *puVar5 = (spki_table *)local_1a8;
    *(int *)(puVar5 + 1) = (int)lVar4;
    *(undefined4 *)((long)puVar5 + 0xc) = 10000;
    uStack_3b0 = 0x1022d7;
    pthread_create((pthread_t *)ppsVar7,(pthread_attr_t *)0x0,add_records,puVar5);
    lVar4 = lVar4 + 10000;
    puVar5 = puVar5 + 2;
    ppsVar7 = ppsVar7 + 1;
  } while (lVar4 != 200000);
  lVar4 = 0;
  do {
    uStack_3b0 = 0x102308;
    pthread_join((pthread_t)(&result)[lVar4],(void **)0x0);
    uStack_3b0 = 0x102315;
    printf("Thread %i returned\n");
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  local_394 = 0;
  iVar6 = 0;
  while( true ) {
    uStack_3b0 = 0x10233f;
    ski = (uint8_t *)malloc(0x80);
    *(int *)(ski + 0x14) = iVar6;
    lVar4 = 0;
    do {
      ski[lVar4] = (char)iVar6 + (char)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    lVar4 = 0;
    do {
      ski[lVar4 + 0x18] = (char)iVar6 + (char)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x5b);
    ski[0x78] = '\0';
    ski[0x79] = '\0';
    ski[0x7a] = '\0';
    ski[0x7b] = '\0';
    ski[0x7c] = '\0';
    ski[0x7d] = '\0';
    ski[0x7e] = '\0';
    ski[0x7f] = '\0';
    uStack_3b0 = 0x10239b;
    spki_table_get_all((spki_table *)local_1a8,*(uint32_t *)(ski + 0x14),ski,
                       &stack0xfffffffffffffc70,&local_394);
    __ptr = psStack_390;
    if (local_394 != 1) {
      uStack_3b0 = 0x102541;
      __assert_fail("result_size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                    ,0x90,"void lock_test1(void)");
    }
    if ((*(uint32_t *)(ski + 0x14) != psStack_390->asn) ||
       (*(rtr_socket **)(ski + 0x78) != psStack_390->socket)) break;
    auVar8[0] = -(psStack_390->ski[0] == *ski);
    auVar8[1] = -(psStack_390->ski[1] == ski[1]);
    auVar8[2] = -(psStack_390->ski[2] == ski[2]);
    auVar8[3] = -(psStack_390->ski[3] == ski[3]);
    auVar8[4] = -(psStack_390->ski[4] == ski[4]);
    auVar8[5] = -(psStack_390->ski[5] == ski[5]);
    auVar8[6] = -(psStack_390->ski[6] == ski[6]);
    auVar8[7] = -(psStack_390->ski[7] == ski[7]);
    auVar8[8] = -(psStack_390->ski[8] == ski[8]);
    auVar8[9] = -(psStack_390->ski[9] == ski[9]);
    auVar8[10] = -(psStack_390->ski[10] == ski[10]);
    auVar8[0xb] = -(psStack_390->ski[0xb] == ski[0xb]);
    auVar8[0xc] = -(psStack_390->ski[0xc] == ski[0xc]);
    auVar8[0xd] = -(psStack_390->ski[0xd] == ski[0xd]);
    auVar8[0xe] = -(psStack_390->ski[0xe] == ski[0xe]);
    auVar8[0xf] = -(psStack_390->ski[0xf] == ski[0xf]);
    uVar1 = *(undefined4 *)(ski + 0x10);
    uVar2 = *(undefined4 *)(psStack_390->ski + 0x10);
    auVar9[0] = -((char)uVar2 == (char)uVar1);
    auVar9[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
    auVar9[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
    auVar9[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
    auVar9[4] = 0xff;
    auVar9[5] = 0xff;
    auVar9[6] = 0xff;
    auVar9[7] = 0xff;
    auVar9[8] = 0xff;
    auVar9[9] = 0xff;
    auVar9[10] = 0xff;
    auVar9[0xb] = 0xff;
    auVar9[0xc] = 0xff;
    auVar9[0xd] = 0xff;
    auVar9[0xe] = 0xff;
    auVar9[0xf] = 0xff;
    auVar9 = auVar9 & auVar8;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) break;
    uStack_3b0 = 0x102411;
    iVar3 = bcmp(ski + 0x18,psStack_390->spki,0x5b);
    if (iVar3 != 0) break;
    uStack_3b0 = 0x102421;
    free(__ptr);
    uStack_3b0 = 0x102429;
    free(ski);
    iVar6 = iVar6 + 1;
    if (iVar6 == 200000) {
      puVar5 = &local_4e8;
      ppsVar7 = &result;
      lVar4 = 0;
      do {
        *puVar5 = (spki_table *)local_1a8;
        *(int *)(puVar5 + 1) = (int)lVar4;
        *(undefined4 *)((long)puVar5 + 0xc) = 10000;
        pthread_create((pthread_t *)ppsVar7,(pthread_attr_t *)0x0,remove_records,puVar5);
        lVar4 = lVar4 + 10000;
        puVar5 = puVar5 + 2;
        ppsVar7 = ppsVar7 + 1;
      } while (lVar4 != 200000);
      lVar4 = 0;
      do {
        pthread_join((pthread_t)(&result)[lVar4],(void **)0x0);
        printf("Thread %i returned\n");
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x14);
      spki_table_free((spki_table *)local_1a8);
      printf("%s() complete\n","lock_test1");
      if (*(long *)(in_FS_OFFSET + 0x28) == spkit.lock._48_8_) {
        return;
      }
      *(code **)(local_3a0 + -8) = add_records;
      __stack_chk_fail();
    }
  }
  uStack_3b0 = 0x102522;
  __assert_fail("compare_spki_records(record, &result[0])",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable_locks.c"
                ,0x91,"void lock_test1(void)");
}

Assistant:

static void lock_test1(void)
{
	unsigned int max_threads = 20;
	unsigned int records_per_thread = 10000;
	struct spki_table spkit;
	struct add_records_args args[max_threads];

	spki_table_init(&spkit, NULL);
	pthread_t threads[max_threads];

	/* Concurrently add SPKI records to the table */
	for (unsigned int i = 0; i < max_threads; i++) {
		args[i].table = &spkit;
		args[i].start_asn = i * records_per_thread;
		args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))add_records, &args[i]);
	}

	/* Wait for parallel add operations to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* Check all records for successful add */
	struct spki_record *result;
	unsigned int result_size = 0;

	for (unsigned int i = 0; i < records_per_thread * max_threads; i++) {
		struct spki_record *record = create_record(i, i, i, NULL);

		spki_table_get_all(&spkit, record->asn, record->ski, &result, &result_size);
		assert(result_size == 1);
		assert(compare_spki_records(record, &result[0]));
		free(result);
		free(record);
	}

	struct remove_records_args remove_args[max_threads];
	/* Concurrently delete SPKI records */
	for (unsigned int i = 0; i < max_threads; i++) {
		remove_args[i].table = &spkit;
		remove_args[i].start_asn = i * records_per_thread;
		remove_args[i].count = records_per_thread;
		pthread_create(&threads[i], NULL, (void *(*)(void *))remove_records, &remove_args[i]);
	}

	/* Wait for parallel delete operation to finish */
	for (unsigned int i = 0; i < max_threads; i++) {
		pthread_join(threads[i], NULL);
		printf("Thread %i returned\n", i);
	}

	/* cleanup: free spki_table */
	spki_table_free(&spkit);
	printf("%s() complete\n", __func__);
}